

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O1

void __thiscall SubtableSymbol::buildDecisionTree(SubtableSymbol *this,DecisionProperties *props)

{
  Pattern *pat;
  int iVar1;
  DecisionNode *pDVar2;
  pointer ppCVar3;
  undefined4 extraout_var;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (this->pattern == (TokenPattern *)0x0) {
    return;
  }
  pDVar2 = (DecisionNode *)operator_new(0x48);
  DecisionNode::DecisionNode(pDVar2,(DecisionNode *)0x0);
  this->decisiontree = pDVar2;
  ppCVar3 = (this->construct).super__Vector_base<Constructor_*,_std::allocator<Constructor_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->construct).super__Vector_base<Constructor_*,_std::allocator<Constructor_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar3) {
    uVar6 = 0;
    do {
      pat = ppCVar3[uVar6]->pattern->pattern;
      iVar1 = (*((Pattern *)&pat->_vptr_Pattern)->_vptr_Pattern[8])(pat);
      if (iVar1 == 0) {
        DecisionNode::addConstructorPair
                  (this->decisiontree,(DisjointPattern *)pat,
                   (this->construct).
                   super__Vector_base<Constructor_*,_std::allocator<Constructor_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6]);
      }
      else {
        iVar1 = (*((Pattern *)&pat->_vptr_Pattern)->_vptr_Pattern[8])(pat);
        if (0 < iVar1) {
          uVar5 = 0;
          do {
            pDVar2 = this->decisiontree;
            iVar1 = (*((Pattern *)&pat->_vptr_Pattern)->_vptr_Pattern[9])(pat,uVar5);
            DecisionNode::addConstructorPair
                      (pDVar2,(DisjointPattern *)CONCAT44(extraout_var,iVar1),
                       (this->construct).
                       super__Vector_base<Constructor_*,_std::allocator<Constructor_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6]);
            uVar4 = (int)uVar5 + 1;
            uVar5 = (ulong)uVar4;
            iVar1 = (*((Pattern *)&pat->_vptr_Pattern)->_vptr_Pattern[8])(pat);
          } while ((int)uVar4 < iVar1);
        }
      }
      uVar6 = uVar6 + 1;
      ppCVar3 = (this->construct).super__Vector_base<Constructor_*,_std::allocator<Constructor_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->construct).
                                   super__Vector_base<Constructor_*,_std::allocator<Constructor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3))
    ;
  }
  DecisionNode::split(this->decisiontree,props);
  return;
}

Assistant:

void SubtableSymbol::buildDecisionTree(DecisionProperties &props)

{				// Associate pattern disjoints to constructors
  if (pattern == (TokenPattern *)0) return; // Pattern not fully formed
  Pattern *pat;
  decisiontree = new DecisionNode((DecisionNode *)0);
  for(int4 i=0;i<construct.size();++i) {
    pat = construct[i]->getPattern()->getPattern();
    if (pat->numDisjoint() == 0)
      decisiontree->addConstructorPair((const DisjointPattern *)pat,construct[i]);
    else
      for(int4 j=0;j<pat->numDisjoint();++j)
	decisiontree->addConstructorPair(pat->getDisjoint(j),construct[i]);
  }
  decisiontree->split(props);	// Create the decision strategy
}